

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

double phyr::averageSampleRange(double *lambda,double *v,int n,double lambda0,double lambda1)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  
  if ((n == 1) || (dVar1 = *lambda, lambda1 <= dVar1)) {
    dVar9 = *v;
  }
  else {
    dVar2 = lambda[(long)n + -1];
    uVar5 = (long)n - 1;
    if (dVar2 <= lambda0) {
      dVar9 = v[uVar5];
    }
    else {
      dVar9 = 0.0;
      if (lambda0 < dVar1) {
        dVar9 = (dVar1 - lambda0) * *v + 0.0;
      }
      if (dVar2 < lambda1) {
        dVar9 = dVar9 + (lambda1 - dVar2) * v[uVar5];
      }
      lVar7 = 0;
      do {
        lVar4 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while (lambda[lVar4] <= lambda0 && lambda0 != lambda[lVar4]);
      uVar8 = (int)lVar7 - 1;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      for (; (uVar6 + 1 != lVar7 && (dVar1 = lambda[lVar7 + -1], dVar1 < lambda1));
          lVar7 = lVar7 + 1) {
        dVar2 = lambda[lVar7];
        dVar10 = 1.0 / (dVar2 - dVar1);
        uVar5 = (ulong)dVar2 & -(ulong)(dVar2 < lambda1);
        auVar13._0_8_ = ~-(ulong)(lambda0 < dVar1) & (ulong)lambda0;
        auVar13._8_8_ = ~-(ulong)(dVar2 < lambda1) & (ulong)lambda1;
        auVar3._8_4_ = (int)uVar5;
        auVar3._0_8_ = (ulong)dVar1 & -(ulong)(lambda0 < dVar1);
        auVar3._12_4_ = (int)(uVar5 >> 0x20);
        dVar12 = SUB168(auVar13 | auVar3,0);
        dVar2 = SUB168(auVar13 | auVar3,8);
        dVar11 = dVar10 * (dVar12 - dVar1);
        dVar10 = dVar10 * (dVar2 - dVar1);
        dVar9 = dVar9 + (v[lVar7 + -1] * (1.0 - dVar10) + v[lVar7] * dVar10 +
                        v[lVar7 + -1] * (1.0 - dVar11) + v[lVar7] * dVar11) * (dVar2 - dVar12) * 0.5
        ;
      }
      dVar9 = dVar9 / (lambda1 - lambda0);
    }
  }
  return dVar9;
}

Assistant:

Real averageSampleRange(const Real* lambda, const Real* v, int n,
                        Real lambda0, Real lambda1) {
    // Check for edge cases
    if (lambda1 <= lambda[0] || n == 1) return v[0];
    if (lambda0 >= lambda[n-1]) return v[n-1];

    // Check for cases of range partial overlap

    // {vsum} stores area under the curve of the overlapped region
    Real vsum = 0;
    if (lambda0 < lambda[0])
        vsum += v[0] * (lambda[0] - lambda0);
    if (lambda1 > lambda[n-1])
        vsum += v[n-1] * (lambda1 - lambda[n-1]);

    // Find first overlapping wavelength segment
    int i = 0;
    while (lambda[i+1] < lambda0) i++;

    // Iterate over overlapping segments
    for (; i < n - 1 && lambda[i] < lambda1; i++) {
        // Compute segment limits
        Real seg0 = std::max(lambda0, lambda[i]);
        Real seg1 = std::min(lambda1, lambda[i+1]);

        // Interpolated values
        Real invLambdaRange = 1.0 / (lambda[i+1] - lambda[i]);
        Real v0 = lerp((seg0 - lambda[i]) * invLambdaRange, v[i], v[i+1]);
        Real v1 = lerp((seg1 - lambda[i]) * invLambdaRange, v[i], v[i+1]);

        // Add the calculated area
        vsum += 0.5 * (seg1 - seg0) * (v0 + v1);
    }

    // Return average value
    return vsum / (lambda1 - lambda0);
}